

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanahijo.h
# Opt level: O1

void __thiscall TanahIjo::TanahIjo(TanahIjo *this)

{
  Polygon::Polygon(&this->super_Polygon);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

TanahIjo() {
    addPoint(Point<double>(0,500));
    addPoint(Point<double>(0,600));
    addPoint(Point<double>(800,600));
    addPoint(Point<double>(800,500));
  }